

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void __thiscall asl::Socket_::Socket_(Socket_ *this,Socket_ *param_1)

{
  Endian EVar1;
  Type TVar2;
  
  (this->super_SmartObject_).rc.n = (param_1->super_SmartObject_).rc.n;
  (this->super_SmartObject_)._vptr_SmartObject_ = (_func_int **)&PTR__Socket__00154650;
  EVar1 = param_1->_endian;
  TVar2 = param_1->_family;
  *(undefined8 *)&(this->super_SmartObject_).field_0xc =
       *(undefined8 *)&(param_1->super_SmartObject_).field_0xc;
  this->_endian = EVar1;
  this->_family = TVar2;
  String::String(&this->_hostname,&param_1->_hostname);
  this->_blocking = param_1->_blocking;
  this->_error = param_1->_error;
  return;
}

Assistant:

ASL_SMART_CLASS(Socket, SmartObject)
{
	ASL_SMART_INNER_DEF(Socket);
	friend class Sockets;
	int _handle;
	enum { TCP, PACKET, LOCAL } _type;
	Endian _endian;
	InetAddress::Type _family;
	String _hostname;
	int _error;
	bool _blocking;
	virtual bool setOption(int level, int opt, const void* p, int n);
	bool init(bool force = false);
	Socket_();
	Socket_(int fd);
	virtual ~Socket_();
	template <class T>
	bool setOption(int level, int opt, const T& val) { return setOption(level, opt, &val, sizeof(T)); }
	void setBlocking(bool b) { _blocking = b; }
	virtual int handle() const { return _handle; }
	void setEndian(Endian e) { _endian = e; }
	virtual bool disconnected();
	virtual bool bind(const String& ip, int port);
	virtual bool bind(const String& path);
	virtual void listen(int n = 5);
	virtual Socket_* accept();
	InetAddress remoteAddress() const;
	InetAddress localAddress() const;
	virtual bool connect(const InetAddress& host);
	virtual void close();
	String readLine();
	virtual int available();
	virtual int read(void* data, int size);
	virtual int write(const void* data, int n);
	ByteArray read(int n = -1);
	void skip(int n);
	virtual bool waitInput(double timeout = 60);
	int error() const { return _error; }
	virtual String errorMsg() const;
}